

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh_builder::commit(xr_mesh_builder *this,xr_object *object)

{
  uint32_t _v0;
  uint32_t _v1;
  bool bVar1;
  size_type sVar2;
  xr_surfmap *this_00;
  reference raw_surface;
  xr_surface *_surface;
  pointer pbVar3;
  reference ppxVar4;
  xr_bone_vec *bones;
  xr_mesh_vec *this_01;
  xr_mesh_builder *local_138;
  vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
  local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
  local_100;
  vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_> local_e8;
  lw_face local_d0;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_b8;
  b_face_vec_it end_1;
  b_face_vec_it it_1;
  undefined1 local_a0 [4];
  uint32_t face_idx;
  vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  local_88;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> local_70;
  vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_> local_58;
  xr_surfmap *local_30;
  xr_surfmap *smap;
  xr_raw_surface_vec_it end;
  xr_raw_surface_vec_it it;
  xr_object *object_local;
  xr_mesh_builder *this_local;
  
  compact_raw_surfaces(this);
  sVar2 = std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::size
                    (&this->m_raw_surfaces);
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::reserve
            (&(this->super_xr_mesh).m_surfmaps,sVar2);
  end._M_current =
       (xr_raw_surface *)
       std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::begin
                 (&this->m_raw_surfaces);
  smap = (xr_surfmap *)
         std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::end
                   (&this->m_raw_surfaces);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_raw_surface_*,_std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>_>
                             *)&smap);
    if (!bVar1) break;
    this_00 = (xr_surfmap *)operator_new(0x20);
    raw_surface = __gnu_cxx::
                  __normal_iterator<xray_re::xr_raw_surface_*,_std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>_>
                  ::operator*(&end);
    _surface = xr_object::attach(object,raw_surface);
    xr_surfmap::xr_surfmap(this_00,_surface);
    local_30 = this_00;
    std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::push_back
              (&(this->super_xr_mesh).m_surfmaps,&local_30);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_raw_surface_*,_std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>_>
    ::operator++(&end);
  }
  memset(&local_58,0,0x18);
  std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::vector(&local_58);
  std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::swap
            (&local_58,&this->m_raw_surfaces);
  std::vector<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::~vector(&local_58)
  ;
  create_smoothing_groups(this);
  memset(&local_70,0,0x18);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::vector
            (&local_70);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::swap
            (&local_70,&this->m_normals);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::~vector
            (&local_70);
  memset(&local_88,0,0x18);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  vector(&local_88);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  swap(&local_88,&this->m_edges);
  std::vector<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>::
  ~vector(&local_88);
  memset(local_a0,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,&this->m_vertex_edges);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
  sVar2 = std::
          vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
          ::size(&this->m_faces);
  std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::reserve
            (&(this->super_xr_mesh).m_faces,sVar2);
  it_1._M_current._4_4_ = 0;
  end_1._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&this->m_faces);
  local_b8._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       end(&this->m_faces);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end_1,&local_b8);
    if (!bVar1) {
      generate_vertex_faces(this);
      bones = xr_object::bones(object);
      create_mappings(this,&(this->super_xr_mesh).m_faces,&(this->super_xr_mesh).m_vmrefs,
                      &(this->super_xr_mesh).m_vmaps,bones);
      memset(&local_e8,0,0x18);
      std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::vector
                (&local_e8);
      std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::swap
                (&local_e8,&this->m_texcoords);
      std::vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::~vector
                (&local_e8);
      memset(&local_100,0,0x18);
      std::
      vector<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ::vector(&local_100);
      std::
      vector<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ::swap(&local_100,&this->m_influences);
      std::
      vector<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ::~vector(&local_100);
      memset(&local_118,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_118);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
                (&local_118,&this->m_vertex_faces);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_118);
      memset(&local_130,0,0x18);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      vector(&local_130);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      swap(&local_130,&this->m_faces);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      ~vector(&local_130);
      xr_mesh::calculate_bbox(&this->super_xr_mesh);
      this_01 = xr_object::meshes(object);
      local_138 = this;
      std::vector<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>::push_back
                (this_01,(value_type *)&local_138);
      return;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end_1);
    _v0 = (pbVar3->field_0).field_0.v[0];
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end_1);
    _v1 = (pbVar3->field_0).field_0.v[1];
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end_1);
    lw_face::lw_face(&local_d0,_v0,_v1,(pbVar3->field_0).field_0.v[2]);
    std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::push_back
              (&(this->super_xr_mesh).m_faces,&local_d0);
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end_1);
    if ((pbVar3->field_1).field_1.surf_idx == 0xffffffff) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end_1);
    ppxVar4 = std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::operator[]
                        (&(this->super_xr_mesh).m_surfmaps,(ulong)(pbVar3->field_1).field_1.surf_idx
                        );
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(*ppxVar4)->faces,(value_type_conflict2 *)((long)&it_1._M_current + 4));
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end_1);
    it_1._M_current._4_4_ = it_1._M_current._4_4_ + 1;
  }
  __assert_fail("it->surf_idx != BAD_IDX",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                ,0x2a4,"void xray_re::xr_mesh_builder::commit(xr_object &)");
}

Assistant:

void xr_mesh_builder::commit(xr_object& object)
{
	compact_raw_surfaces();
	m_surfmaps.reserve(m_raw_surfaces.size());
	for (xr_raw_surface_vec_it it = m_raw_surfaces.begin(), end = m_raw_surfaces.end();
			it != end; ++it) {
		xr_surfmap* smap = new xr_surfmap(object.attach(*it));
		m_surfmaps.push_back(smap);
	}
	xr_raw_surface_vec().swap(m_raw_surfaces);

	create_smoothing_groups();
	std::vector<fvector3>().swap(m_normals);
	b_edge_vec().swap(m_edges);
	std::vector<uint32_t>().swap(m_vertex_edges);

	xr_mesh::m_faces.reserve(m_faces.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		xr_mesh::m_faces.push_back(lw_face(it->v0, it->v1, it->v2));
		xr_assert(it->surf_idx != BAD_IDX);
		m_surfmaps[it->surf_idx]->faces.push_back(face_idx);
	}

	generate_vertex_faces();
	create_mappings(xr_mesh::m_faces, m_vmrefs, m_vmaps, object.bones());
	std::vector<fvector2>().swap(m_texcoords);
	std::vector<finfluence>().swap(m_influences);
	std::vector<uint32_t>().swap(m_vertex_faces);
	b_face_vec().swap(m_faces);

	calculate_bbox();

	object.meshes().push_back(this);
}